

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O3

double WebRtcIsac_GetSnr(double bottle_neck,int framesamples)

{
  double dVar1;
  
  if (framesamples == 0x3c0) {
    dVar1 = 0.53;
  }
  else {
    if (framesamples != 0x1e0) {
      if (framesamples != 0x140) {
        return 0.0;
      }
      dVar1 = bottle_neck * 0.8 * 0.001 + -30.0;
      goto LAB_001526d5;
    }
    dVar1 = 0.48;
  }
  dVar1 = dVar1 * bottle_neck * 0.001 + -23.0;
LAB_001526d5:
  return bottle_neck * 0.0 * bottle_neck * 1e-06 + dVar1;
}

Assistant:

double WebRtcIsac_GetSnr(
    double bottle_neck,
    int    framesamples)
{
  double s2nr;

  const double a_20 = -30.0;
  const double b_20 = 0.8;
  const double c_20 = 0.0;

  const double a_30 = -23.0;
  const double b_30 = 0.48;
  const double c_30 = 0.0;

  const double a_60 = -23.0;
  const double b_60 = 0.53;
  const double c_60 = 0.0;


  /* find new SNR value */
  switch(framesamples) {
    case 320:
      s2nr = a_20 + b_20 * bottle_neck * 0.001 + c_20 * bottle_neck *
          bottle_neck * 0.000001;
      break;
    case 480:
      s2nr = a_30 + b_30 * bottle_neck * 0.001 + c_30 * bottle_neck *
          bottle_neck * 0.000001;
      break;
    case 960:
      s2nr = a_60 + b_60 * bottle_neck * 0.001 + c_60 * bottle_neck *
          bottle_neck * 0.000001;
      break;
    default:
      s2nr = 0;
  }

  return s2nr;

}